

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

Vec_Int_t * Gia_ManGroupProve(Gia_Man_t *pInit,char *pCommLine,int nGroupSize,int fVerbose)

{
  int iVar1;
  Abc_Frame_t *pAbc;
  Gia_Man_t *p;
  abctime aVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Ptr_t *p_02;
  void **ppvVar3;
  Gia_Man_t *pNew;
  abctime aVar4;
  abctime aVar5;
  Abc_Cex_t *Entry;
  Vec_Int_t *pVVar6;
  Vec_Ptr_t *p_03;
  void *Entry_00;
  ulong uVar7;
  abctime time;
  abctime time_00;
  uint uVar8;
  int iVar9;
  Gia_Man_t *pGVar10;
  int iVar11;
  ulong uVar12;
  char *pStr;
  int local_a0;
  int local_9c;
  Vec_Ptr_t *vCexes;
  
  pAbc = Abc_FrameReadGlobalFrame();
  p = Gia_ManDup(pInit);
  iVar1 = (int)pInit;
  aVar2 = Abc_Clock();
  if (nGroupSize < 1) {
    __assert_fail("nGroupSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x734,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  if (pCommLine == (char *)0x0) {
    __assert_fail("pCommLine != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x735,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  if (p->nConstrs != 0) {
    __assert_fail("p->nConstrs == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x736,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  uVar12 = 0;
  Abc_Print(iVar1,"RUNNING MultiProve: Group size = %d. Command line = \"%s\".\n",
            (ulong)(uint)nGroupSize,pCommLine);
  uVar8 = p->vCos->nSize - p->nRegs;
  p_00 = Vec_IntAlloc(uVar8);
  p_00->nSize = uVar8;
  uVar7 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar7 = uVar12;
  }
  for (; uVar7 != uVar12; uVar12 = uVar12 + 1) {
    p_00->pArray[uVar12] = (int)uVar12;
  }
  p_01 = Vec_IntAlloc(p->vCos->nSize - p->nRegs);
  iVar9 = p->vCos->nSize - p->nRegs;
  p_02 = (Vec_Ptr_t *)malloc(0x10);
  iVar1 = 8;
  if (6 < iVar9 - 1U) {
    iVar1 = iVar9;
  }
  p_02->nSize = 0;
  p_02->nCap = iVar1;
  if (iVar1 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar1 << 3);
  }
  p_02->pArray = ppvVar3;
  uVar8 = (uint)(0 < iVar9 % nGroupSize) + iVar9 / nGroupSize;
  uVar7 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar7 = 0;
  }
  local_9c = 0;
  pStr = (char *)0x0;
  uVar12 = 0;
  local_a0 = nGroupSize;
  vCexes = p_02;
  while (uVar12 != uVar7) {
    iVar9 = p->vCos->nSize - p->nRegs;
    iVar11 = (int)(uVar12 * (uint)nGroupSize);
    iVar1 = iVar9 - iVar11;
    if ((int)(uVar12 + 1) * nGroupSize < iVar9) {
      iVar1 = nGroupSize;
    }
    pGVar10 = p;
    pNew = Gia_ManDupCones(p,p_00->pArray + uVar12 * (uint)nGroupSize,iVar1,0);
    Abc_Print((int)pGVar10,"GROUP %4d : %4d <= PoId < %4d : ",uVar12 & 0xffffffff,
              (ulong)(uint)((int)uVar12 * nGroupSize),(ulong)(uint)(iVar1 + iVar11));
    Abc_FrameUpdateGia(pAbc,pNew);
    aVar4 = Abc_Clock();
    Cmd_CommandExecute(pAbc,pCommLine);
    aVar5 = Abc_Clock();
    if (nGroupSize == 1) {
      iVar1 = Abc_FrameReadProbStatus(pAbc);
      Vec_IntPush(p_01,iVar1);
      Entry = Abc_FrameReadCex(pAbc);
      Vec_PtrPush(p_02,Entry);
    }
    else {
      pVVar6 = Abc_FrameReadPoStatuses(pAbc);
      p_03 = Abc_FrameReadCexVec(pAbc);
      if (pVVar6 == (Vec_Int_t *)0x0) {
        __assert_fail("vStatusCur != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                      ,0x753,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
      }
      if (local_a0 < iVar9) {
        iVar9 = local_a0;
      }
      iVar11 = 0;
      iVar1 = iVar9 + local_9c;
      if (iVar9 + local_9c < 1) {
        iVar1 = iVar11;
      }
      for (; iVar1 != iVar11; iVar11 = iVar11 + 1) {
        iVar9 = Vec_IntEntry(pVVar6,iVar11);
        Vec_IntPush(p_01,iVar9);
        if (p_03 == (Vec_Ptr_t *)0x0) {
          Entry_00 = (void *)0x0;
        }
        else {
          Entry_00 = Vec_PtrEntry(p_03,iVar11);
        }
        Vec_PtrPush(p_02,Entry_00);
      }
    }
    pStr = pStr + (aVar5 - aVar4);
    local_a0 = local_a0 + nGroupSize;
    local_9c = local_9c - nGroupSize;
    uVar12 = uVar12 + 1;
  }
  uVar8 = p_02->nSize;
  if (uVar8 != p->vCos->nSize - p->nRegs) {
    __assert_fail("Vec_PtrSize(vCexes) == Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x75c,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  if (p_01->nSize == uVar8) {
    uVar7 = 0;
    uVar12 = 0;
    if (0 < (int)uVar8) {
      uVar12 = (ulong)uVar8;
    }
    iVar1 = 0;
    for (; uVar12 != uVar7; uVar7 = uVar7 + 1) {
      iVar1 = iVar1 + (uint)(p_02->pArray[uVar7] == (void *)0x0);
    }
    if (iVar1 < (int)uVar8) {
      Abc_FrameReplaceCexVec(pAbc,&vCexes);
      iVar1 = (int)pAbc;
    }
    else {
      free(p_02->pArray);
      free(p_02);
      iVar1 = (int)p_02;
    }
    Abc_Print(iVar1,"SUMMARY:  ");
    Abc_Print(iVar1,"Properties = %6d. ",(ulong)(uint)(p->vCos->nSize - p->nRegs));
    pVVar6 = p_01;
    uVar8 = Vec_IntCountEntry(p_01,1);
    Abc_Print((int)pVVar6,"UNSAT = %6d. ",(ulong)uVar8);
    pVVar6 = p_01;
    uVar8 = Vec_IntCountEntry(p_01,0);
    Abc_Print((int)pVVar6,"SAT = %6d. ",(ulong)uVar8);
    pVVar6 = p_01;
    uVar8 = Vec_IntCountEntry(p_01,-1);
    iVar1 = (int)pVVar6;
    Abc_Print(iVar1,"UNDEC = %6d. ",(ulong)uVar8);
    Abc_Print(iVar1,"\n");
    Abc_PrintTime(0x80d3ef,pStr,time);
    aVar4 = Abc_Clock();
    Abc_PrintTime(0x80d3fc,(char *)(aVar4 - aVar2),time_00);
    Vec_IntFree(p_00);
    Gia_ManStop(p);
    return p_01;
  }
  __assert_fail("Vec_IntSize(vOutMap) == Gia_ManPoNum(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                ,0x75d,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
}

Assistant:

Vec_Int_t * Gia_ManGroupProve( Gia_Man_t * pInit, char * pCommLine, int nGroupSize, int fVerbose )
{
    Abc_Frame_t * pAbc = Abc_FrameReadGlobalFrame();
    Gia_Man_t * p = Gia_ManDup( pInit );
    Gia_Man_t * pGroup;
    Vec_Int_t * vOuts;
    Vec_Int_t * vOutMap;
    Vec_Ptr_t * vCexes;
    int i, k, nGroupCur, nGroups;
    abctime clk, timeComm = 0;
    abctime timeStart = Abc_Clock();
    // pre-conditions
    assert( nGroupSize > 0 );
    assert( pCommLine != NULL );
    assert( p->nConstrs == 0 );
    Abc_Print( 1, "RUNNING MultiProve: Group size = %d. Command line = \"%s\".\n", nGroupSize, pCommLine );
    // create output map
    vOuts   = Vec_IntStartNatural( Gia_ManPoNum(p) );
    vOutMap = Vec_IntAlloc( Gia_ManPoNum(p) );
    vCexes  = Vec_PtrAlloc( Gia_ManPoNum(p) );
    nGroups = Gia_ManPoNum(p) / nGroupSize + (int)((Gia_ManPoNum(p) % nGroupSize) > 0);
    for ( i = 0; i < nGroups; i++ )
    {
        // derive the group
        nGroupCur = ((i + 1) * nGroupSize < Gia_ManPoNum(p)) ? nGroupSize : Gia_ManPoNum(p) - i * nGroupSize;
        pGroup = Gia_ManDupCones( p, Vec_IntArray(vOuts) + i * nGroupSize, nGroupCur, 0 );
        Abc_Print( 1, "GROUP %4d : %4d <= PoId < %4d : ", i, i * nGroupSize, i * nGroupSize + nGroupCur );
        // set the current GIA
        Abc_FrameUpdateGia( pAbc, pGroup );
        // solve the group
        clk = Abc_Clock();
        Cmd_CommandExecute( pAbc, pCommLine );
        timeComm += Abc_Clock() - clk;
        // get the solution status
        if ( nGroupSize == 1 )
        {
            Vec_IntPush( vOutMap, Abc_FrameReadProbStatus(pAbc) );
            Vec_PtrPush( vCexes, Abc_FrameReadCex(pAbc) );
        }
        else // if ( nGroupSize > 1 )  
        {
            Vec_Int_t * vStatusCur = Abc_FrameReadPoStatuses( pAbc );
            Vec_Ptr_t * vCexesCur = Abc_FrameReadCexVec( pAbc );
            assert( vStatusCur != NULL ); // only works for "bmc3" and "pdr"
//            assert( vCexesCur != NULL );
            for ( k = 0; k < nGroupCur; k++ )
            {
                Vec_IntPush( vOutMap, Vec_IntEntry(vStatusCur, k) );
                Vec_PtrPush( vCexes, vCexesCur ? Vec_PtrEntry(vCexesCur, k) : NULL );
            }
        }
    }
    assert( Vec_PtrSize(vCexes) == Gia_ManPoNum(p) );
    assert( Vec_IntSize(vOutMap) == Gia_ManPoNum(p) );
    // set CEXes
    if ( Vec_PtrCountZero(vCexes) < Vec_PtrSize(vCexes) )
        Abc_FrameReplaceCexVec( pAbc, &vCexes );
    else  // there is no CEXes
        Vec_PtrFree( vCexes );
    // report the result
    Abc_Print( 1, "SUMMARY:  " );
    Abc_Print( 1, "Properties = %6d. ", Gia_ManPoNum(p) );
    Abc_Print( 1, "UNSAT = %6d. ",      Vec_IntCountEntry(vOutMap, 1) );
    Abc_Print( 1, "SAT = %6d. ",        Vec_IntCountEntry(vOutMap, 0) );
    Abc_Print( 1, "UNDEC = %6d. ",      Vec_IntCountEntry(vOutMap, -1) );
    Abc_Print( 1, "\n" );
    Abc_PrintTime( 1, "Command time", timeComm );
    Abc_PrintTime( 1, "Total time  ", Abc_Clock() - timeStart );
    // cleanup
    Vec_IntFree( vOuts );
    Gia_ManStop( p );
    return vOutMap;
}